

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O3

int CfdAddTapBranchByScriptTree(void *handle,void *tree_handle,void *branch_tree)

{
  Script *pSVar1;
  TapBranch *this;
  TaprootScriptTree *this_00;
  TapBranch *branch;
  TapBranch local_a0;
  
  cfd::Initialize();
  pSVar1 = &local_a0.script_;
  local_a0._vptr_TapBranch = (_func_int **)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"TapscriptTree","");
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_a0);
  if ((Script *)local_a0._vptr_TapBranch != pSVar1) {
    operator_delete(local_a0._vptr_TapBranch);
  }
  local_a0._vptr_TapBranch = (_func_int **)pSVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"TapscriptTree","");
  cfd::capi::CheckBuffer(branch_tree,(string *)&local_a0);
  if ((Script *)local_a0._vptr_TapBranch != pSVar1) {
    operator_delete(local_a0._vptr_TapBranch);
  }
  branch = (TapBranch *)**(long **)((long)branch_tree + 0x18);
  if ((branch == (TapBranch *)(*(long **)((long)branch_tree + 0x18))[1]) &&
     (branch = (TapBranch *)**(long **)((long)branch_tree + 0x10),
     (TapBranch *)(*(long **)((long)branch_tree + 0x10))[1] == branch)) {
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  this = (TapBranch *)**(undefined8 **)((long)tree_handle + 0x18);
  if (this == (TapBranch *)(*(undefined8 **)((long)tree_handle + 0x18))[1]) {
    this_00 = (TaprootScriptTree *)**(undefined8 **)((long)tree_handle + 0x10);
    if ((TaprootScriptTree *)(*(undefined8 **)((long)tree_handle + 0x10))[1] == this_00) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
    }
    cfd::core::TaprootScriptTree::AddBranch(this_00,branch);
  }
  else {
    cfd::core::TapBranch::ToString_abi_cxx11_((string *)&local_a0,this);
    if ((Script *)local_a0._vptr_TapBranch != pSVar1) {
      operator_delete(local_a0._vptr_TapBranch);
    }
    if (local_a0._8_8_ == 0) {
      cfd::core::TapBranch::TapBranch(&local_a0,branch);
      cfd::core::TapBranch::operator=(this,&local_a0);
      cfd::core::TapBranch::~TapBranch(&local_a0);
    }
    else {
      cfd::core::TapBranch::AddBranch(this,branch);
    }
  }
  return 0;
}

Assistant:

int CfdAddTapBranchByScriptTree(
    void* handle, void* tree_handle, void* branch_tree) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CheckBuffer(branch_tree, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    CfdCapiTapscriptTree* branch_buffer =
        static_cast<CfdCapiTapscriptTree*>(branch_tree);

    TapBranch* src_tree;
    if (!branch_buffer->branch_buffer->empty()) {
      src_tree = &branch_buffer->branch_buffer->at(0);
    } else {
      src_tree = &branch_buffer->tree_buffer->at(0);
    }

    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.ToString().empty()) {
        branch = TapBranch(*src_tree);  // override
      } else {
        branch.AddBranch(*src_tree);
      }
    } else {
      auto& dest_tree = buffer->tree_buffer->at(0);
      dest_tree.AddBranch(*src_tree);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}